

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::PackedInt32::_InternalSerialize
          (PackedInt32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_24_1_493b367e_for_PackedInt32_3 *this_00;
  int *piVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  ulong uVar7;
  uint extraout_EDX;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  bool bVar11;
  
  uVar9 = *(uint *)((long)&this->field_0 + 0x10);
  pbVar10 = target;
  if (0 < (int)uVar9) {
    pbVar5 = stream->end_;
    if (pbVar5 <= target) {
      pbVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar5 = stream->end_;
    }
    if (pbVar5 <= pbVar10) {
      _InternalSerialize();
      uVar9 = extraout_EDX;
      goto LAB_001e4948;
    }
    this_00 = &this->field_0;
    pbVar10[0] = 0x82;
    pbVar10[1] = 0x80;
    pbVar10[2] = 1;
    pbVar5 = pbVar10 + 3;
    uVar8 = uVar9;
    if (uVar9 < 0x80) {
      pbVar10 = pbVar10 + 2;
    }
    else {
      do {
        pbVar10 = pbVar5;
        *pbVar10 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = pbVar10 + 1;
        bVar11 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar11);
    }
    *pbVar5 = (byte)uVar9;
    if ((undefined1  [24])((undefined1  [24])*this_00 & (undefined1  [24])0x4) ==
        (undefined1  [24])0x0) {
      piVar3 = (int *)((long)&this->field_0 + 8);
      bVar11 = true;
    }
    else {
      piVar3 = (int *)google::protobuf::internal::LongSooRep::elements
                                ((LongSooRep *)&this_00->_impl_);
      bVar11 = (undefined1  [24])((undefined1  [24])*this_00 & (undefined1  [24])0x4) ==
               (undefined1  [24])0x0;
    }
    pbVar10 = pbVar10 + 2;
    iVar2 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,bVar11);
    piVar1 = piVar3 + iVar2;
    do {
      if (stream->end_ <= pbVar10) {
        pbVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar10);
      }
      uVar7 = (ulong)*piVar3;
      uVar4 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar10 = (byte)uVar4 | 0x80;
          uVar7 = uVar4 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar11 = 0x3fff < uVar4;
          uVar4 = uVar7;
        } while (bVar11);
      }
      piVar3 = piVar3 + 1;
      *pbVar10 = (byte)uVar7;
      pbVar10 = pbVar10 + 1;
    } while (piVar3 < piVar1);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffe;
    target = *(uint8_t **)(uVar4 + 8);
    uVar9 = *(uint *)(uVar4 + 0x10);
    if ((long)stream->end_ - (long)pbVar10 < (long)(int)uVar9) {
LAB_001e4948:
      puVar6 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,target,uVar9,pbVar10);
      return puVar6;
    }
    memcpy(pbVar10,target,(ulong)uVar9);
    pbVar10 = pbVar10 + (int)uVar9;
  }
  return pbVar10;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL PackedInt32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const PackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.PackedInt32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 2048 [features = {
  {
    int byte_size = this_._impl_._repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2048, this_._internal_repeated_int32(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.PackedInt32)
  return target;
}